

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonString.cpp
# Opt level: O3

string * __thiscall
json::JsonString::escaped_abi_cxx11_(string *__return_storage_ptr__,JsonString *this)

{
  char cVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this->value)._M_string_length != 0) {
    uVar2 = 0;
    do {
      cVar1 = (this->value)._M_dataplus._M_p[uVar2];
      switch(cVar1) {
      case '\b':
        break;
      case '\t':
        break;
      case '\n':
        break;
      case '\v':
switchD_0010a0f2_caseD_b:
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        goto LAB_0010a146;
      case '\f':
        break;
      case '\r':
        break;
      default:
        if ((cVar1 != '\"') && (cVar1 != '\\')) goto switchD_0010a0f2_caseD_b;
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_0010a146:
      uVar2 = uVar2 + 1;
    } while (uVar2 < (this->value)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JsonString::escaped() const noexcept
    {
        std::string result;

        // Go through each character and check if one of them need to be escaped.
        for (size_t i = 0; i < value.length(); i++)
        {
            switch (value[i])
            {
            case '\"':
                result += "\\\"";
                break;
            case '\\':
                result += "\\\\";
                break;
            case '\b':
                result += "\\b";
                break;
            case '\f':
                result += "\\f";
                break;
            case '\n':
                result += "\\n";
                break;
            case '\r':
                result += "\\r";
                break;
            case '\t':
                result += "\\t";
                break;
            default:
                result += value[i];
                break;
            }
        }

        return result;
    }